

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Address.cpp
# Opt level: O1

uint16 __thiscall
Network::Address::URL::stripPortFromAuthority
          (URL *this,uint16 defaultPortValue,bool saveNewAuthority)

{
  String *this_00;
  int iVar1;
  int portPos;
  String auth;
  String portValue;
  uint local_54;
  String local_50;
  String local_40;
  String local_30;
  
  this_00 = &this->authority;
  iVar1 = Bstrlib::String::Find(this_00,']',0);
  if (iVar1 == -1) {
    Bstrlib::String::String(&local_50,this_00);
  }
  else {
    Bstrlib::String::midString(&local_50,(int)this_00,iVar1 + 1);
  }
  local_54 = Bstrlib::String::reverseFind(&local_50,':',local_50.super_tagbstring.slen);
  if (local_54 != 0xffffffff) {
    Bstrlib::String::midString(&local_40,(int)&local_50,local_54 + 1);
    if (saveNewAuthority) {
      Bstrlib::operator+((char *)&local_30,(String *)":");
      Bstrlib::String::findAndReplace(this_00,&local_30,"",0);
      Bstrlib::String::~String(&local_30);
    }
    local_54 = (uint)defaultPortValue;
    Bstrlib::String::Scan(&local_40,"%d",&local_54);
    if ((int)local_54 < 0) {
      local_54 = 0;
    }
    if (0xffff < (int)local_54) {
      local_54 = 0xffff;
    }
    defaultPortValue = (uint16)local_54;
    Bstrlib::String::~String(&local_40);
  }
  Bstrlib::String::~String(&local_50);
  return defaultPortValue;
}

Assistant:

uint16 URL::stripPortFromAuthority(uint16 defaultPortValue, const bool saveNewAuthority)
        {
            int pos = authority.Find(']'); // Check IPV6
            String auth = pos == -1 ? authority : authority.midString(pos + 1, authority.getLength());
            int portPos = auth.reverseFind(':', auth.getLength());
            if (portPos != -1)
            {
                String portValue = auth.midString(portPos+1, auth.getLength());
                if (saveNewAuthority) authority.findAndReplace(":"+portValue, "");
                portPos = defaultPortValue;
                portValue.Scan("%d", &portPos);
                if (portPos < 0) portPos = 0;
                if (portPos > 65535) portPos = 65535;
                return (uint16)portPos;
            }
            return defaultPortValue;
        }